

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::VerifyInputFilesInDescriptors
          (CommandLineInterface *this,DescriptorDatabase *database)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  ostream *poVar5;
  pointer pbVar6;
  FileDescriptorProto file_descriptor;
  FileDescriptorProto FStack_128;
  
  pbVar6 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    bVar2 = pbVar6 == pbVar1;
    if (bVar2) {
      return bVar2;
    }
    FileDescriptorProto::FileDescriptorProto(&FStack_128,(Arena *)0x0);
    iVar3 = (*database->_vptr_DescriptorDatabase[2])(database,pbVar6,&FStack_128);
    if ((char)iVar3 == '\0') break;
    if ((this->disallow_services_ == true) &&
       (0 < FStack_128.field_0._impl_.service_.super_RepeatedPtrFieldBase.current_size_)) {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,
                          *(char **)((ulong)FStack_128.field_0._impl_.name_.tagged_ptr_.ptr_ &
                                    0xfffffffffffffffc),
                          ((undefined8 *)
                          ((ulong)FStack_128.field_0._impl_.name_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc))[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,": This file contains services, but --disallow_services was used.",0x40);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      goto LAB_00d7d512;
    }
    FileDescriptorProto::~FileDescriptorProto(&FStack_128);
    pbVar6 = pbVar6 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Could not find file in descriptor database: ",0x2c);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
  __s = strerror(2);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
LAB_00d7d512:
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  FileDescriptorProto::~FileDescriptorProto(&FStack_128);
  return bVar2;
}

Assistant:

bool IsFieldCompatible(const FieldDescriptor& field,
                       FieldOptions::OptionTargetType target_type) {
  const RepeatedField<int>& allowed_targets = field.options().targets();
  return allowed_targets.empty() ||
         absl::c_linear_search(allowed_targets, target_type);
}